

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.cpp
# Opt level: O3

void duckdb_nanoarrow::ArrowSchemaRelease(ArrowSchema *schema)

{
  long lVar1;
  ArrowSchema *pAVar2;
  ArrowSchema **__ptr;
  long lVar3;
  
  if (schema->format != (char *)0x0) {
    free(schema->format);
  }
  if (schema->name != (char *)0x0) {
    free(schema->name);
  }
  if (schema->metadata != (char *)0x0) {
    free(schema->metadata);
  }
  __ptr = schema->children;
  if (__ptr != (ArrowSchema **)0x0) {
    lVar1 = schema->n_children;
    if (0 < lVar1) {
      lVar3 = 0;
      do {
        pAVar2 = schema->children[lVar3];
        if (pAVar2 != (ArrowSchema *)0x0) {
          if (pAVar2->release != (_func_void_ArrowSchema_ptr *)0x0) {
            (*pAVar2->release)(pAVar2);
            pAVar2 = schema->children[lVar3];
          }
          free(pAVar2);
          lVar1 = schema->n_children;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < lVar1);
      __ptr = schema->children;
    }
    free(__ptr);
  }
  pAVar2 = schema->dictionary;
  if (pAVar2 != (ArrowSchema *)0x0) {
    if (pAVar2->release != (_func_void_ArrowSchema_ptr *)0x0) {
      (*pAVar2->release)(pAVar2);
      pAVar2 = schema->dictionary;
    }
    free(pAVar2);
  }
  if (schema->private_data != (void *)0x0) {
    free(schema->private_data);
  }
  schema->release = (_func_void_ArrowSchema_ptr *)0x0;
  return;
}

Assistant:

void ArrowSchemaRelease(struct ArrowSchema *schema) {
	if (schema->format != NULL)
		ArrowFree((void *)schema->format);
	if (schema->name != NULL)
		ArrowFree((void *)schema->name);
	if (schema->metadata != NULL)
		ArrowFree((void *)schema->metadata);

	// This object owns the memory for all the children, but those
	// children may have been generated elsewhere and might have
	// their own release() callback.
	if (schema->children != NULL) {
		for (int64_t i = 0; i < schema->n_children; i++) {
			if (schema->children[i] != NULL) {
				if (schema->children[i]->release != NULL) {
					schema->children[i]->release(schema->children[i]);
				}

				ArrowFree(schema->children[i]);
			}
		}

		ArrowFree(schema->children);
	}

	// This object owns the memory for the dictionary but it
	// may have been generated somewhere else and have its own
	// release() callback.
	if (schema->dictionary != NULL) {
		if (schema->dictionary->release != NULL) {
			schema->dictionary->release(schema->dictionary);
		}

		ArrowFree(schema->dictionary);
	}

	// private data not currently used
	if (schema->private_data != NULL) {
		ArrowFree(schema->private_data);
	}

	schema->release = NULL;
}